

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

long ogg_page_pageno(ogg_page *og)

{
  ogg_page *og_local;
  
  return (ulong)CONCAT13(og->header[0x15],
                         CONCAT12(og->header[0x14],CONCAT11(og->header[0x13],og->header[0x12])));
}

Assistant:

long ogg_page_pageno(const ogg_page *og){
  return((long)((ogg_uint32_t)og->header[18]) |
               ((ogg_uint32_t)og->header[19]<<8) |
               ((ogg_uint32_t)og->header[20]<<16) |
               ((ogg_uint32_t)og->header[21]<<24));
}